

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

int yin_print_model_(lyout *out,int level,lys_module *module)

{
  lys_import *plVar1;
  lys_include *plVar2;
  lys_ext *plVar3;
  lys_feature *plVar4;
  lys_deviation *plVar5;
  lys_type *type;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int extraout_EAX;
  lys_module *plVar10;
  lys_module *plVar11;
  lys_deviate *plVar12;
  long lVar13;
  lyout *plVar14;
  undefined4 in_register_00000034;
  int endflag;
  char *pcVar15;
  lys_deviate *plVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  lys_node *plVar22;
  undefined8 local_68;
  int close;
  ulong local_58;
  int local_4c;
  lyout *plStack_48;
  int content;
  ulong local_40;
  lys_module *local_38;
  
  _close = CONCAT44(in_register_00000034,level);
  if ((module->field_0x40 & 0x30) == 0x10) {
    ly_print(out,"<!-- DEVIATED -->\n");
  }
  uVar6 = (int)_close * 2;
  uVar21 = (int)_close + 1;
  local_58 = (ulong)uVar21;
  plStack_48 = out;
  if ((module->field_0x40 & 1) == 0) {
    ly_print(out,"%*s<module name=\"%s\"\n",(ulong)uVar6,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    bVar7 = (byte)module->field_0x40 >> 1 & 7;
    if (bVar7 != 0) {
      pcVar15 = "1";
      if (bVar7 == 2) {
        pcVar15 = "1.1";
      }
      yin_print_substmt(out,uVar21,LYEXT_SUBSTMT_VERSION,'\0',pcVar15,module,module->ext,
                        (uint)module->ext_size);
    }
    yin_print_substmt(out,uVar21,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                      (uint)module->ext_size);
    yin_print_substmt(out,uVar21,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                      (uint)module->ext_size);
  }
  else {
    ly_print(out,"%*s<submodule name=\"%s\"\n",(ulong)uVar6,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    plVar10 = lys_main_module(module);
    if (((plVar10->field_0x40 & 0xc) != 0) ||
       (iVar17 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar17 != -1
       )) {
      pcVar15 = "1";
      if (((ulong)module->data->parent & 0xe) == 4) {
        pcVar15 = "1.1";
      }
      yin_print_substmt(out,uVar21,LYEXT_SUBSTMT_VERSION,'\0',pcVar15,module,module->ext,
                        (uint)module->ext_size);
    }
    yin_print_open(out,uVar21,(char *)0x0,"belongs-to","module",module->data->dsc,1);
    iVar17 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_BELONGSTO);
    if (iVar17 != -1) {
      iVar8 = (int)_close;
      do {
        yin_print_extension_instances
                  (out,iVar8 + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + iVar17,1);
        iVar17 = lys_ext_iter(module->ext,module->ext_size,(char)iVar17 + '\x01',
                              LYEXT_SUBSTMT_BELONGSTO);
      } while (iVar17 != -1);
    }
    yin_print_substmt(out,(int)_close + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,
                      module->ext,(uint)module->ext_size);
    ly_print(out,"%*s</%s>\n",(ulong)(uint)((int)local_58 * 2),"","belongs-to");
  }
  plVar14 = plStack_48;
  if (module->imp_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,(int)_close + 2);
    iVar17 = (int)local_58;
    lVar13 = 0;
    uVar19 = 0;
    do {
      yin_print_open(plVar14,(int)local_58,(char *)0x0,"import","module",
                     *(char **)(*(long *)(module->imp->rev + lVar13 + -0x10) + 8),1);
      iVar8 = (int)local_40;
      yin_print_extension_instances
                (plVar14,(int)local_40,module,LYEXT_SUBSTMT_SELF,'\0',
                 *(lys_ext_instance ***)(module->imp->rev + lVar13 + 0x10),
                 (uint)(byte)module->imp->rev[lVar13 + 0xb]);
      plVar1 = module->imp;
      yin_print_substmt(plVar14,iVar8,LYEXT_SUBSTMT_PREFIX,'\0',
                        *(char **)(plVar1->rev + lVar13 + -8),module,
                        *(lys_ext_instance ***)(plVar1->rev + lVar13 + 0x10),
                        (uint)(byte)plVar1->rev[lVar13 + 0xb]);
      plVar1 = module->imp;
      if (plVar1->rev[lVar13] != '\0') {
        yin_print_substmt(plVar14,(int)local_40,LYEXT_SUBSTMT_REVISIONDATE,'\0',plVar1->rev + lVar13
                          ,module,*(lys_ext_instance ***)(plVar1->rev + lVar13 + 0x10),
                          (uint)(byte)plVar1->rev[lVar13 + 0xb]);
      }
      plVar1 = module->imp;
      iVar8 = (int)local_40;
      yin_print_substmt(plVar14,(int)local_40,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                        *(char **)(plVar1->rev + lVar13 + 0x18),module,
                        *(lys_ext_instance ***)(plVar1->rev + lVar13 + 0x10),
                        (uint)(byte)plVar1->rev[lVar13 + 0xb]);
      plVar1 = module->imp;
      yin_print_substmt(plVar14,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',
                        *(char **)(plVar1->rev + lVar13 + 0x20),module,
                        *(lys_ext_instance ***)(plVar1->rev + lVar13 + 0x10),
                        (uint)(byte)plVar1->rev[lVar13 + 0xb]);
      ly_print(plVar14,"%*s</%s>\n",iVar17 * 2,"","import");
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 0x38;
    } while (uVar19 < module->imp_size);
  }
  plVar14 = plStack_48;
  if (module->inc_size != '\0') {
    iVar17 = (int)_close + 2;
    local_40 = CONCAT44(local_40._4_4_,(int)local_58 * 2);
    lVar13 = 0x18;
    uVar19 = 0;
    do {
      plVar2 = module->inc;
      if ((((plVar2->rev[lVar13 + -0x18] == '\0') && (*(long *)(plVar2->rev + lVar13) == 0)) &&
          (*(long *)(plVar2->rev + lVar13 + 8) == 0)) && (plVar2->rev[lVar13 + -0xd] == '\0')) {
        yin_print_open(plStack_48,(int)local_58,(char *)0x0,"include","module",
                       *(char **)(*(long *)(plVar2->rev + lVar13 + -0x20) + 8),-1);
      }
      else {
        yin_print_open(plVar14,(int)local_58,(char *)0x0,"include","module",
                       *(char **)(*(long *)(plVar2->rev + lVar13 + -0x20) + 8),1);
        yin_print_extension_instances
                  (plVar14,iVar17,module,LYEXT_SUBSTMT_SELF,'\0',
                   *(lys_ext_instance ***)(module->inc->rev + lVar13 + -8),
                   (uint)(byte)module->inc->rev[lVar13 + -0xd]);
        if (module->inc->rev[lVar13 + -0x18] != '\0') {
          pcVar15 = module->inc->rev + lVar13 + -8;
          yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_REVISIONDATE,'\0',pcVar15 + -0x10,module,
                            *(lys_ext_instance ***)pcVar15,(uint)(byte)pcVar15[-5]);
        }
        plVar2 = module->inc;
        yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                          *(char **)(plVar2->rev + lVar13),module,
                          *(lys_ext_instance ***)(plVar2->rev + lVar13 + -8),
                          (uint)(byte)plVar2->rev[lVar13 + -0xd]);
        plVar2 = module->inc;
        yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_REFERENCE,'\0',
                          *(char **)(plVar2->rev + lVar13 + 8),module,
                          *(lys_ext_instance ***)(plVar2->rev + lVar13 + -8),
                          (uint)(byte)plVar2->rev[lVar13 + -0xd]);
        ly_print(plVar14,"%*s</%s>\n",local_40 & 0xffffffff,"","include");
      }
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 0x30;
    } while (uVar19 < module->inc_size);
  }
  plVar14 = plStack_48;
  uVar19 = local_58;
  iVar17 = (int)local_58;
  yin_print_substmt(plStack_48,iVar17,LYEXT_SUBSTMT_ORGANIZATION,'\0',module->org,module,module->ext
                    ,(uint)module->ext_size);
  yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_CONTACT,'\0',module->contact,module,module->ext,
                    (uint)module->ext_size);
  yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->dsc,module,module->ext,
                    (uint)module->ext_size);
  yin_print_substmt(plVar14,iVar17,LYEXT_SUBSTMT_REFERENCE,'\0',module->ref,module,module->ext,
                    (uint)module->ext_size);
  if (module->rev_size != '\0') {
    lVar13 = 0;
    uVar20 = 0;
    do {
      yin_print_revision(plVar14,iVar17,module,(lys_revision *)(module->rev->date + lVar13));
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x28;
    } while (uVar20 < module->rev_size);
  }
  local_38 = module;
  if (module->extensions_size != '\0') {
    iVar17 = (int)_close + 2;
    local_40 = CONCAT44(local_40._4_4_,(int)_close + 3);
    uVar20 = 0;
    do {
      plVar3 = local_38->extensions;
      plVar22 = (lys_node *)(plVar3 + uVar20);
      local_68._0_4_ = 0;
      yin_print_open(plVar14,(int)uVar19,(char *)0x0,"extension","name",plVar3[uVar20].name,0);
      yin_print_snode_common(plVar14,iVar17,plVar22,plVar3[uVar20].module,(int *)&local_68,1);
      if (plVar3[uVar20].argument != (char *)0x0) {
        if ((int)local_68 == 0) {
          local_68._0_4_ = 1;
          ly_print(plVar14,">\n");
        }
        iVar9 = 0;
        yin_print_open(plVar14,iVar17,(char *)0x0,"argument","name",(char *)plVar22->iffeature,0);
        iVar8 = lys_ext_iter(plVar22->ext,plVar22->ext_size,'\0',LYEXT_SUBSTMT_ARGUMENT);
        if (iVar8 != -1) {
          iVar9 = 0;
          do {
            if (iVar9 == 0) {
              ly_print(plStack_48,">\n");
              iVar9 = 1;
            }
            yin_print_extension_instances
                      (plStack_48,(int)local_40,plVar22->module,LYEXT_SUBSTMT_ARGUMENT,'\0',
                       plVar22->ext + iVar8,1);
            iVar8 = lys_ext_iter(plVar22->ext,plVar22->ext_size,(char)iVar8 + '\x01',
                                 LYEXT_SUBSTMT_ARGUMENT);
          } while (iVar8 != -1);
        }
        if (((plVar22->flags & 1) != 0) ||
           (iVar8 = lys_ext_iter(plVar22->ext,plVar22->ext_size,'\0',LYEXT_SUBSTMT_YINELEM),
           plVar14 = plStack_48, iVar8 != -1)) {
          if (iVar9 == 0) {
            ly_print(plStack_48,">\n");
            iVar9 = 1;
          }
          plVar14 = plStack_48;
          pcVar15 = "true";
          if ((plVar22->flags & 1) == 0) {
            pcVar15 = "false";
          }
          yin_print_substmt(plStack_48,(int)local_40,LYEXT_SUBSTMT_YINELEM,'\0',pcVar15,
                            plVar22->module,plVar22->ext,(uint)plVar22->ext_size);
        }
        yin_print_close(plVar14,iVar17,(char *)0x0,"argument",iVar9);
      }
      yin_print_snode_common(plVar14,iVar17,plVar22,plVar22->module,(int *)&local_68,0x70);
      uVar19 = local_58;
      yin_print_close(plVar14,(int)local_58,(char *)0x0,"extension",(int)local_68);
      uVar20 = uVar20 + 1;
    } while (uVar20 < local_38->extensions_size);
  }
  plVar10 = local_38;
  iVar17 = (int)uVar19;
  if (local_38->ext_size != 0) {
    yin_print_extension_instances
              (plVar14,iVar17,local_38,LYEXT_SUBSTMT_SELF,'\0',local_38->ext,
               (uint)local_38->ext_size);
  }
  if (plVar10->features_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,(int)_close + 2);
    lVar13 = 0;
    uVar20 = 0;
    do {
      plVar4 = local_38->features;
      local_68._0_4_ = 0;
      yin_print_open(plStack_48,iVar17,(char *)0x0,"feature","name",
                     *(char **)(plVar4->padding + lVar13 + -0x1c),0);
      plVar10 = local_38;
      plVar14 = plStack_48;
      yin_print_snode_common
                (plStack_48,(int)local_40,(lys_node *)(plVar4->padding + lVar13 + -0x1c),
                 *(lys_module **)(plVar4->padding + lVar13 + 0x14),(int *)&local_68,0x73);
      yin_print_close(plVar14,iVar17,(char *)0x0,"feature",(int)local_68);
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x40;
    } while (uVar20 < plVar10->features_size);
  }
  if (plVar10->ident_size != 0) {
    iVar8 = (int)_close + 2;
    uVar20 = 0;
    do {
      plVar22 = (lys_node *)(plVar10->ident + uVar20);
      local_4c = 0;
      local_40 = uVar20;
      yin_print_open(plVar14,(int)uVar19,(char *)0x0,"identity","name",plVar22->name,0);
      yin_print_snode_common(plVar14,iVar8,plVar22,plVar22->module,&local_4c,3);
      if (plVar22->padding[3] != '\0') {
        uVar19 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(plStack_48,">\n");
          }
          plVar10 = lys_main_module(*(lys_module **)
                                     (*(long *)(*(long *)&plVar22->nodetype + uVar19 * 8) + 0x30));
          plVar11 = lys_main_module(plVar22->module);
          if (plVar11 == plVar10) {
            yin_print_substmt(plStack_48,iVar8,LYEXT_SUBSTMT_BASE,(uint8_t)uVar19,
                              (char *)**(undefined8 **)(*(long *)&plVar22->nodetype + uVar19 * 8),
                              plVar22->module,plVar22->ext,(uint)plVar22->ext_size);
          }
          else {
            pcVar15 = transform_module_name2import_prefix(plVar22->module,plVar10->name);
            asprintf((char **)&local_68,"%s:%s",pcVar15,
                     **(undefined8 **)(*(long *)&plVar22->nodetype + uVar19 * 8));
            yin_print_substmt(plStack_48,iVar8,LYEXT_SUBSTMT_BASE,(uint8_t)uVar19,
                              (char *)CONCAT44(local_68._4_4_,(int)local_68),plVar22->module,
                              plVar22->ext,(uint)plVar22->ext_size);
            free((void *)CONCAT44(local_68._4_4_,(int)local_68));
          }
          uVar19 = uVar19 + 1;
          plVar10 = local_38;
        } while (uVar19 < plVar22->padding[3]);
      }
      plVar14 = plStack_48;
      yin_print_snode_common(plStack_48,iVar8,plVar22,plVar22->module,&local_4c,0x70);
      uVar19 = local_58;
      iVar17 = (int)local_58;
      yin_print_close(plVar14,iVar17,(char *)0x0,"identity",local_4c);
      uVar20 = local_40 + 1;
    } while (uVar20 < plVar10->ident_size);
  }
  if (plVar10->tpdf_size != '\0') {
    lVar13 = 0;
    uVar19 = 0;
    do {
      yin_print_typedef(plVar14,iVar17,plVar10,(lys_tpdf *)(plVar10->tpdf->padding + lVar13 + -0x1c)
                       );
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 0x80;
    } while (uVar19 < plVar10->tpdf_size);
  }
  plVar10 = lys_main_module(plVar10);
  for (plVar22 = plVar10->data; plVar22 != (lys_node *)0x0; plVar22 = plVar22->next) {
    if (plVar22->module == local_38) {
      yin_print_snode(plVar14,iVar17,plVar22,0x800);
    }
  }
  plVar10 = lys_main_module(local_38);
  for (plVar22 = plVar10->data; plVar10 = local_38, plVar22 != (lys_node *)0x0;
      plVar22 = plVar22->next) {
    if (plVar22->module == local_38) {
      yin_print_snode(plVar14,iVar17,plVar22,0x903f);
    }
  }
  if (local_38->augment_size != '\0') {
    lVar13 = 0;
    uVar19 = 0;
    do {
      yin_print_augment(plVar14,iVar17,plVar10,
                        (lys_node_augment *)(plVar10->augment->padding + lVar13 + -0x1c));
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 0x68;
    } while (uVar19 < plVar10->augment_size);
  }
  plVar10 = lys_main_module(plVar10);
  for (plVar22 = plVar10->data; plVar22 != (lys_node *)0x0; plVar22 = plVar22->next) {
    if (plVar22->module == local_38) {
      yin_print_snode(plVar14,iVar17,plVar22,0x4100);
    }
  }
  plVar10 = lys_main_module(local_38);
  for (plVar22 = plVar10->data; plVar22 != (lys_node *)0x0; plVar22 = plVar22->next) {
    if (plVar22->module == local_38) {
      yin_print_snode(plVar14,iVar17,plVar22,0x80);
    }
  }
  if (local_38->deviation_size != '\0') {
    iVar17 = (int)_close;
    iVar8 = iVar17 + 2;
    uVar21 = iVar17 * 2 + 4;
    local_40 = CONCAT44(local_40._4_4_,iVar17 + 3);
    _close = (ulong)(iVar17 + 4);
    iVar17 = (int)local_58;
    uVar19 = 0;
    do {
      plVar5 = local_38->deviation;
      pcVar15 = transform_json2schema(local_38,plVar5[uVar19].target_name);
      yin_print_open(plVar14,(int)local_58,(char *)0x0,"deviation","target-node",pcVar15,1);
      plVar10 = local_38;
      lydict_remove(local_38->ctx,pcVar15);
      if (plVar5[uVar19].ext_size != 0) {
        yin_print_extension_instances
                  (plVar14,iVar8,plVar10,LYEXT_SUBSTMT_SELF,'\0',plVar5[uVar19].ext,
                   (uint)plVar5[uVar19].ext_size);
      }
      yin_print_substmt(plVar14,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar5[uVar19].dsc,plVar10,
                        plVar5[uVar19].ext,(uint)plVar5[uVar19].ext_size);
      yin_print_substmt(plVar14,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',plVar5[uVar19].ref,plVar10,
                        plVar5[uVar19].ext,(uint)plVar5[uVar19].ext_size);
      if (plVar5[uVar19].deviate_size != '\0') {
        uVar20 = 0;
        do {
          ly_print(plVar14,"%*s<deviate value=",(ulong)uVar21,"");
          pcVar15 = "\"add\">\n";
          switch(plVar5[uVar19].deviate[uVar20].mod) {
          case LY_DEVIATE_NO:
            pcVar15 = "\"not-supported\">\n";
            if (plVar5[uVar19].deviate[uVar20].ext_size != '\0') break;
            ly_print(plVar14,"\"not-supported\"/>\n");
            goto LAB_0017b1dc;
          case LY_DEVIATE_ADD:
            break;
          case LY_DEVIATE_RPL:
            pcVar15 = "\"replace\">\n";
            break;
          case LY_DEVIATE_DEL:
            pcVar15 = "\"delete\">\n";
            break;
          default:
            goto switchD_0017adb9_default;
          }
          ly_print(plVar14,pcVar15);
switchD_0017adb9_default:
          plVar10 = local_38;
          bVar7 = plVar5[uVar19].deviate[uVar20].ext_size;
          if (bVar7 != 0) {
            yin_print_extension_instances
                      (plVar14,(int)local_40,local_38,LYEXT_SUBSTMT_SELF,'\0',
                       plVar5[uVar19].deviate[uVar20].ext,(uint)bVar7);
          }
          type = plVar5[uVar19].deviate[uVar20].type;
          iVar9 = (int)local_40;
          if (type != (lys_type *)0x0) {
            yin_print_type(plVar14,(int)local_40,plVar10,type);
          }
          plVar12 = plVar5[uVar19].deviate;
          yin_print_substmt(plVar14,iVar9,LYEXT_SUBSTMT_UNITS,'\0',plVar12[uVar20].units,plVar10,
                            plVar12[uVar20].ext,(uint)plVar12[uVar20].ext_size);
          plVar12 = plVar5[uVar19].deviate;
          if (plVar12[uVar20].must_size != '\0') {
            lVar13 = 0;
            uVar18 = 0;
            do {
              yin_print_must(plVar14,(int)local_40,plVar10,
                             (lys_restr *)((long)&(plVar12[uVar20].must)->expr + lVar13));
              uVar18 = uVar18 + 1;
              plVar12 = plVar5[uVar19].deviate;
              lVar13 = lVar13 + 0x38;
              plVar10 = local_38;
            } while (uVar18 < plVar12[uVar20].must_size);
          }
          plVar12 = plVar5[uVar19].deviate;
          if (plVar12[uVar20].unique_size != '\0') {
            uVar18 = 0;
            iVar9 = (int)local_40;
            do {
              yin_print_unique(plVar14,iVar9,plVar12[uVar20].unique + uVar18);
              iVar9 = -1;
              while (iVar9 = lys_ext_iter(plVar5[uVar19].deviate[uVar20].ext,
                                          plVar5[uVar19].deviate[uVar20].ext_size,
                                          (char)iVar9 + '\x01',LYEXT_SUBSTMT_UNIQUE), iVar9 != -1) {
                if (uVar18 == plVar5[uVar19].deviate[uVar20].ext[iVar9]->insubstmt_index) {
                  ly_print(plVar14,">\n");
                  do {
                    yin_print_extension_instances
                              (plVar14,(int)_close,local_38,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar18,
                               plVar5[uVar19].deviate[uVar20].ext + iVar9,1);
                    do {
                      iVar9 = lys_ext_iter(plVar5[uVar19].deviate[uVar20].ext,
                                           plVar5[uVar19].deviate[uVar20].ext_size,
                                           (char)iVar9 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                      if (iVar9 == -1) {
                        endflag = 1;
                        goto LAB_0017b000;
                      }
                    } while (uVar18 != plVar5[uVar19].deviate[uVar20].ext[iVar9]->insubstmt_index);
                  } while( true );
                }
              }
              endflag = 0;
LAB_0017b000:
              iVar9 = (int)local_40;
              yin_print_close(plVar14,(int)local_40,(char *)0x0,"unique",endflag);
              uVar18 = uVar18 + 1;
              plVar12 = plVar5[uVar19].deviate;
            } while (uVar18 < plVar12[uVar20].unique_size);
          }
          plVar10 = local_38;
          plVar16 = plVar5[uVar19].deviate;
          plVar12 = plVar16 + uVar20;
          if (plVar12->dflt_size != '\0') {
            uVar18 = 0;
            iVar9 = (int)local_40;
            do {
              yin_print_substmt(plStack_48,iVar9,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,
                                plVar12->dflt[uVar18],plVar10,plVar12->ext,(uint)plVar12->ext_size);
              uVar18 = uVar18 + 1;
              plVar16 = plVar5[uVar19].deviate;
              plVar12 = plVar16 + uVar20;
            } while (uVar18 < plVar12->dflt_size);
          }
          plVar14 = plStack_48;
          pcVar15 = "true";
          if (((plVar12->flags & 1) != 0) || (pcVar15 = "false", (plVar12->flags & 2) != 0)) {
            yin_print_substmt(plStack_48,(int)local_40,LYEXT_SUBSTMT_CONFIG,'\0',pcVar15,local_38,
                              plVar16->ext,(uint)plVar12->ext_size);
          }
          plVar12 = plVar5[uVar19].deviate;
          pcVar15 = "true";
          if (((plVar12[uVar20].flags & 0x40) != 0) ||
             (pcVar15 = "false", (char)plVar12[uVar20].flags < '\0')) {
            yin_print_substmt(plVar14,(int)local_40,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar15,local_38,
                              plVar12[uVar20].ext,(uint)plVar12[uVar20].ext_size);
          }
          plVar12 = plVar5[uVar19].deviate;
          if (plVar12[uVar20].min_set != '\0') {
            yin_print_unsigned(plVar14,(int)local_40,LYEXT_SUBSTMT_MIN,'\0',local_38,
                               plVar12[uVar20].ext,(uint)plVar12[uVar20].ext_size,
                               plVar12[uVar20].min);
          }
          plVar12 = plVar5[uVar19].deviate;
          if (plVar12[uVar20].max_set != '\0') {
            if (plVar12[uVar20].max == 0) {
              yin_print_substmt(plVar14,(int)local_40,LYEXT_SUBSTMT_MAX,'\0',"unbounded",local_38,
                                plVar12[uVar20].ext,(uint)plVar12[uVar20].ext_size);
            }
            else {
              yin_print_unsigned(plVar14,(int)local_40,LYEXT_SUBSTMT_MAX,'\0',local_38,
                                 plVar12[uVar20].ext,(uint)plVar12[uVar20].ext_size,
                                 plVar12[uVar20].max);
            }
          }
          ly_print(plVar14,"%*s</%s>\n",(ulong)uVar21,"");
LAB_0017b1dc:
          uVar20 = uVar20 + 1;
        } while (uVar20 < plVar5[uVar19].deviate_size);
      }
      ly_print(plVar14,"%*s</%s>\n",(ulong)(uint)(iVar17 * 2),"","deviation");
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_38->deviation_size);
  }
  pcVar15 = "%*s</submodule>\n";
  if ((local_38->field_0x40 & 1) == 0) {
    pcVar15 = "%*s</module>\n";
  }
  ly_print(plVar14,pcVar15,(ulong)uVar6,"");
  ly_print_flush(plVar14);
  return extraout_EAX;
}

Assistant:

static int
yin_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;
    struct lys_node *node;

    if (module->deviated == 1) {
        ly_print(out, "<!-- DEVIATED -->\n");
    }

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*s<submodule name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                              ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_open(out, level, NULL, "belongs-to", "module", ((struct lys_submodule *)module)->belongsto->name, 1);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yin_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yin_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                          module, module->ext, module->ext_size);
        yin_print_close(out, level, NULL, "belongs-to", 1);
    } else {
        ly_print(out, "%*s<module name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (module->version) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                          module, module->ext, module->ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        yin_print_open(out, level, NULL, "import", "module", module->imp[i].module->name, 1);
        level++;

        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                              module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                          module, module->imp[i].ext, module->imp[i].ext_size);

        level--;
        yin_print_close(out, level, NULL, "import", 1);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, 1);
            level++;

            yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                          module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                  module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                              module, module->inc[i].ext, module->inc[i].ext_size);

            level--;
            yin_print_close(out, level, NULL, "include", 1);
        } else {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, -1);
        }
    }

    /* meta-stmts */
    yin_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                      module, module->ext, module->ext_size);

    /* revision-stmts */
    for (i = 0; i < module->rev_size; i++) {
        yin_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; ++i) {
        yin_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        yin_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        yin_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        yin_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        yin_print_augment(out, level, module, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        yin_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    if (module->type) {
        ly_print(out, "%*s</submodule>\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*s</module>\n", LEVEL, INDENT);
    }
    ly_print_flush(out);

    return EXIT_SUCCESS;
}